

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall Refal2::CFunctionBuilder::addRule(CFunctionBuilder *this)

{
  bool bVar1;
  CRule *this_00;
  CRule *pCVar2;
  pointer pCVar3;
  CFunctionBuilder *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->firstRule);
  if (bVar1) {
    pCVar2 = this->lastRule;
    this_00 = (CRule *)operator_new(0x60);
    CRule::CRule(this_00);
    std::unique_ptr<Refal2::CRule,_std::default_delete<Refal2::CRule>_>::reset
              (&pCVar2->NextRule,this_00);
    pCVar3 = std::unique_ptr<Refal2::CRule,_std::default_delete<Refal2::CRule>_>::get
                       (&this->lastRule->NextRule);
    this->lastRule = pCVar3;
  }
  else {
    pCVar2 = (CRule *)operator_new(0x60);
    CRule::CRule(pCVar2);
    std::unique_ptr<Refal2::CRule,_std::default_delete<Refal2::CRule>_>::reset
              (&this->firstRule,pCVar2);
    pCVar3 = std::unique_ptr<Refal2::CRule,_std::default_delete<Refal2::CRule>_>::get
                       (&this->firstRule);
    this->lastRule = pCVar3;
  }
  this->lastRule->RightMatching = (bool)((this->super_CVariablesBuilder).field_0x1aad & 1);
  CNodeList<Refal2::CUnit>::Move
            (&(this->leftPart).super_CNodeList<Refal2::CUnit>,
             (CNodeList<Refal2::CUnit> *)this->lastRule);
  CNodeList<Refal2::CUnit>::Move
            (&(this->acc).super_CNodeList<Refal2::CUnit>,
             &(this->lastRule->Right).super_CNodeList<Refal2::CUnit>);
  CVariablesBuilder::Export(&this->super_CVariablesBuilder,&this->lastRule->Variables);
  return;
}

Assistant:

void CFunctionBuilder::addRule()
{
	if( static_cast<bool>( firstRule ) ) {
		lastRule->NextRule.reset( new CRule );
		lastRule = lastRule->NextRule.get();
	} else {
		firstRule.reset( new CRule );
		lastRule = firstRule.get();
	}

	lastRule->RightMatching = isRightDirection;
	leftPart.Move( lastRule->Left );
	acc.Move( lastRule->Right );
	CVariablesBuilder::Export( lastRule->Variables );
}